

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void calculate_fake_group_size_and_set(Am_Object *fake_group,Am_Value_List *list)

{
  int iVar1;
  int iVar2;
  int max_bottom;
  int max_right;
  int min_top;
  int min_left;
  Am_Object owner;
  int top_offset;
  int left_offset;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Am_Object local_40;
  Am_Object local_38;
  int local_30;
  int local_2c;
  Am_Value_List local_28;
  
  local_44 = 29999;
  local_48 = 29999;
  local_4c = -29999;
  local_50 = -29999;
  local_40.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_28,list);
  calculate_group_size(&local_28,&local_44,&local_48,&local_4c,&local_50,&local_40);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)fake_group,10);
  Am_Translate_Coordinates(&local_40,0,0,&local_38,&local_2c,&local_30);
  Am_Object::~Am_Object(&local_38);
  iVar1 = local_44;
  Am_Object::Set(fake_group,100,local_2c + local_44,0);
  iVar2 = local_48;
  Am_Object::Set(fake_group,0x65,local_30 + local_48,0);
  iVar1 = local_4c - iVar1;
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  Am_Object::Set(fake_group,0x66,iVar1,0);
  iVar2 = local_50 - iVar2;
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  Am_Object::Set(fake_group,0x67,iVar2,0);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

void
calculate_fake_group_size_and_set(Am_Object &fake_group, Am_Value_List &list)
{
  int min_left = 29999;
  int min_top = 29999;
  int max_right = -29999;
  int max_bottom = -29999;
  int left_offset, top_offset;
  Am_Object owner;
  calculate_group_size(list, min_left, min_top, max_right, max_bottom, owner);
  Am_Translate_Coordinates(owner, 0, 0, fake_group.Get_Owner(), left_offset,
                           top_offset);
  fake_group.Set(Am_LEFT, min_left + left_offset);
  fake_group.Set(Am_TOP, min_top + top_offset);
  int wh = max_right - min_left;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_WIDTH, wh);
  wh = max_bottom - min_top;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_HEIGHT, wh);
  //std::cout << "Calculate fake group " << fake_group << " size = " << min_left
  // << "," << min_top << "," << max_right - min_left << ","
  // << max_bottom - min_top <<std::endl <<std::flush;
}